

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

int __thiscall
icu_63::VTimeZone::clone(VTimeZone *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  VTimeZone *this_00;
  undefined8 local_30;
  VTimeZone *this_local;
  
  this_00 = (VTimeZone *)UMemory::operator_new((UMemory *)0x120,(size_t)__fn);
  local_30 = (VTimeZone *)0x0;
  if (this_00 != (VTimeZone *)0x0) {
    VTimeZone(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

TimeZone*
VTimeZone::clone(void) const {
    return new VTimeZone(*this);
}